

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodemodule * NodeClassModule(anynode *Any,fourcc_t ClassId)

{
  nodeclass *local_30;
  nodeclass *Class;
  nodemodule *Module;
  nodecontext *p;
  fourcc_t ClassId_local;
  anynode *Any_local;
  
  if (Any == (anynode *)0x0) {
    __assert_fail("(const void*)(Any)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x5a4,"nodemodule *NodeClassModule(anynode *, fourcc_t)");
  }
  Class = (nodeclass *)**(undefined8 **)((long)Any + 8);
  local_30 = (nodeclass *)0x0;
  if (ClassId != 0) {
    local_30 = NodeContext_FindClass(Class,ClassId);
  }
  if (local_30 != (nodeclass *)0x0) {
    Class = (nodeclass *)local_30->Module;
  }
  return (nodemodule *)Class;
}

Assistant:

nodemodule* NodeClassModule(anynode* Any,fourcc_t ClassId)
{
    nodecontext* p = Node_Context(Any);
    nodemodule* Module = NULL;
    const nodeclass* Class = NULL;
    if (ClassId)
    {
        Class = NodeContext_FindClass(p,ClassId);
    }
    if (Class)
        Module = Class->Module;
    else
        Module = &p->Base;
    return Module;
}